

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParseContentInternal(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  int iVar2;
  int iVar3;
  xmlParserInputPtr pxVar4;
  xmlChar *pxVar5;
  unsigned_long uVar6;
  xmlChar *pxVar7;
  
  iVar2 = ctxt->nameNr;
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  do {
    pxVar4 = ctxt->input;
    pxVar5 = pxVar4->cur;
    xVar1 = *pxVar5;
    if (xVar1 == '\0') {
      return;
    }
    if (ctxt->instate == XML_PARSER_EOF) {
      return;
    }
    iVar3 = pxVar4->id;
    uVar6 = pxVar4->consumed;
    pxVar7 = pxVar4->base;
    if (xVar1 == '<') {
      if (pxVar5[1] == '?') {
        xmlParsePI(ctxt);
      }
      else if (((((pxVar5[1] == '!') && (pxVar5[2] == '[')) && (pxVar5[3] == 'C')) &&
               ((pxVar5[4] == 'D' && (pxVar5[5] == 'A')))) &&
              ((pxVar5[6] == 'T' && ((pxVar5[7] == 'A' && (pxVar5[8] == '[')))))) {
        xmlParseCDSect(ctxt);
      }
      else {
        if ((pxVar5[1] != '!') || ((pxVar5[2] != '-' || (pxVar5[3] != '-')))) goto LAB_00162355;
        xmlParseComment(ctxt);
        ctxt->instate = XML_PARSER_CONTENT;
      }
    }
    else {
LAB_00162355:
      if (xVar1 == '&') {
        xmlParseReference(ctxt);
      }
      else if (xVar1 == '<') {
        if (pxVar5[1] == '/') {
          if (ctxt->nameNr <= iVar2) {
            return;
          }
          xmlParseElementEnd(ctxt);
        }
        else {
          xmlParseElementStart(ctxt);
        }
      }
      else {
        xmlParseCharData(ctxt,0);
      }
    }
    if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlGROW(ctxt);
    }
    if (ctxt->progressive == 0) {
      pxVar4 = ctxt->input;
      if ((500 < (long)pxVar4->cur - (long)pxVar4->base) &&
         ((long)pxVar4->end - (long)pxVar4->cur < 500)) {
        xmlSHRINK(ctxt);
      }
    }
    pxVar4 = ctxt->input;
    if ((pxVar5 + (uVar6 - (long)pxVar7) == pxVar4->cur + (pxVar4->consumed - (long)pxVar4->base))
       && (iVar3 == pxVar4->id)) {
      xmlFatalErr(ctxt,XML_ERR_INTERNAL_ERROR,"detected an error in element content\n");
      xmlHaltParser(ctxt);
      return;
    }
  } while( true );
}

Assistant:

static void
xmlParseContentInternal(xmlParserCtxtPtr ctxt) {
    int nameNr = ctxt->nameNr;

    GROW;
    while ((RAW != 0) &&
	   (ctxt->instate != XML_PARSER_EOF)) {
        int id = ctxt->input->id;
	unsigned long cons = CUR_CONSUMED;
	const xmlChar *cur = ctxt->input->cur;

	/*
	 * First case : a Processing Instruction.
	 */
	if ((*cur == '<') && (cur[1] == '?')) {
	    xmlParsePI(ctxt);
	}

	/*
	 * Second case : a CDSection
	 */
	/* 2.6.0 test was *cur not RAW */
	else if (CMP9(CUR_PTR, '<', '!', '[', 'C', 'D', 'A', 'T', 'A', '[')) {
	    xmlParseCDSect(ctxt);
	}

	/*
	 * Third case :  a comment
	 */
	else if ((*cur == '<') && (NXT(1) == '!') &&
		 (NXT(2) == '-') && (NXT(3) == '-')) {
	    xmlParseComment(ctxt);
	    ctxt->instate = XML_PARSER_CONTENT;
	}

	/*
	 * Fourth case :  a sub-element.
	 */
	else if (*cur == '<') {
            if (NXT(1) == '/') {
                if (ctxt->nameNr <= nameNr)
                    break;
	        xmlParseElementEnd(ctxt);
            } else {
	        xmlParseElementStart(ctxt);
            }
	}

	/*
	 * Fifth case : a reference. If if has not been resolved,
	 *    parsing returns it's Name, create the node
	 */

	else if (*cur == '&') {
	    xmlParseReference(ctxt);
	}

	/*
	 * Last case, text. Note that References are handled directly.
	 */
	else {
	    xmlParseCharData(ctxt, 0);
	}

	GROW;
	SHRINK;

	if ((cons == CUR_CONSUMED) && (id == ctxt->input->id)) {
	    xmlFatalErr(ctxt, XML_ERR_INTERNAL_ERROR,
	                "detected an error in element content\n");
	    xmlHaltParser(ctxt);
            break;
	}
    }
}